

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

void __thiscall ElfFile::loadElfHeader(ElfFile *this)

{
  ByteArray *this_00;
  uchar uVar1;
  byte *pbVar2;
  ulong uVar3;
  undefined8 uVar4;
  Elf32_Word EVar5;
  Elf32_Addr EVar6;
  Elf32_Off EVar7;
  Elf32_Half EVar8;
  Endianness endianness;
  Elf32_Half EVar9;
  
  pbVar2 = (this->fileData).data_;
  uVar3 = (this->fileData).size_;
  uVar4 = *(undefined8 *)(pbVar2 + 8);
  *(undefined8 *)(this->fileHeader).e_ident = *(undefined8 *)pbVar2;
  *(undefined8 *)((this->fileHeader).e_ident + 8) = uVar4;
  uVar1 = (this->fileHeader).e_ident[5];
  EVar8 = 0xffff;
  EVar9 = 0xffff;
  if (0x11 < uVar3) {
    EVar9 = CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x10],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x11]
                    );
  }
  this_00 = &this->fileData;
  (this->fileHeader).e_type = EVar9;
  if (0x13 < uVar3) {
    EVar8 = CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x12],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x13]
                    );
  }
  (this->fileHeader).e_machine = EVar8;
  endianness = (Endianness)(uVar1 != '\x02');
  EVar5 = ByteArray::getDoubleWord(this_00,0x14,endianness);
  (this->fileHeader).e_version = EVar5;
  EVar6 = ByteArray::getDoubleWord(this_00,0x18,endianness);
  (this->fileHeader).e_entry = EVar6;
  EVar7 = ByteArray::getDoubleWord(this_00,0x1c,endianness);
  (this->fileHeader).e_phoff = EVar7;
  EVar7 = ByteArray::getDoubleWord(this_00,0x20,endianness);
  (this->fileHeader).e_shoff = EVar7;
  EVar5 = ByteArray::getDoubleWord(this_00,0x24,endianness);
  (this->fileHeader).e_flags = EVar5;
  uVar3 = (this->fileData).size_;
  EVar8 = 0xffff;
  EVar9 = 0xffff;
  if (0x29 < uVar3) {
    EVar9 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x28],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x29]);
  }
  (this->fileHeader).e_ehsize = EVar9;
  if (0x2b < uVar3) {
    EVar8 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x2a],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x2b]);
  }
  (this->fileHeader).e_phentsize = EVar8;
  EVar8 = 0xffff;
  EVar9 = 0xffff;
  if (0x2d < uVar3) {
    EVar9 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x2c],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x2d]);
  }
  (this->fileHeader).e_phnum = EVar9;
  if (0x2f < uVar3) {
    EVar8 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x2e],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x2f]);
  }
  (this->fileHeader).e_shentsize = EVar8;
  EVar8 = 0xffff;
  EVar9 = 0xffff;
  if (0x31 < uVar3) {
    EVar9 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x30],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x31]);
  }
  (this->fileHeader).e_shnum = EVar9;
  if (0x33 < uVar3) {
    EVar8 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x32],
                     this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x33]);
  }
  (this->fileHeader).e_shstrndx = EVar8;
  return;
}

Assistant:

void ElfFile::loadElfHeader()
{
	memcpy(fileHeader.e_ident, &fileData[0], sizeof(fileHeader.e_ident));
	Endianness endianness = getEndianness();
	fileHeader.e_type = fileData.getWord(0x10, endianness);
	fileHeader.e_machine = fileData.getWord(0x12, endianness);
	fileHeader.e_version = fileData.getDoubleWord(0x14, endianness);
	fileHeader.e_entry = fileData.getDoubleWord(0x18, endianness);
	fileHeader.e_phoff = fileData.getDoubleWord(0x1C, endianness);
	fileHeader.e_shoff = fileData.getDoubleWord(0x20, endianness);
	fileHeader.e_flags = fileData.getDoubleWord(0x24, endianness);
	fileHeader.e_ehsize = fileData.getWord(0x28, endianness);
	fileHeader.e_phentsize = fileData.getWord(0x2A, endianness);
	fileHeader.e_phnum = fileData.getWord(0x2C, endianness);
	fileHeader.e_shentsize = fileData.getWord(0x2E, endianness);
	fileHeader.e_shnum = fileData.getWord(0x30, endianness);
	fileHeader.e_shstrndx = fileData.getWord(0x32, endianness);
}